

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::GetOwnPropertyInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *pRVar4;
  undefined4 *puVar5;
  undefined1 local_60 [8];
  PropertyDescriptor propertyDescriptorValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == GetOwnPropertyInfoActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar3 = Js::JavascriptOperators::IsObject(instance);
      if (BVar3 != 0) {
        pRVar4 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
        }
        Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
        pRVar4 = Js::VarTo<Js::RecyclableObject>(instance);
        BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                          (pRVar4,evt[2].EventKind,scriptContext,(PropertyDescriptor *)local_60);
        if (BVar3 == 0) {
          pRVar4 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        else {
          pRVar4 = (RecyclableObject *)
                   Js::JavascriptOperators::FromPropertyDescriptor
                             ((PropertyDescriptor *)local_60,scriptContext);
        }
        if (pRVar4 != (RecyclableObject *)0x0) {
          BVar3 = Js::CrossSite::NeedMarshalVar(pRVar4,scriptContext);
          if (BVar3 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                               ,0x273,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))"
                               ,"res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
        }
        JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)53>
                  (executeContext,evt,pRVar4);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void GetOwnPropertyInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::GetOwnPropertyInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = nullptr;
            Js::PropertyDescriptor propertyDescriptorValue;
            if(Js::JavascriptOperators::GetOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(var), GetPropertyIdItem(action), ctx, &propertyDescriptorValue))
            {
                res = Js::JavascriptOperators::FromPropertyDescriptor(propertyDescriptorValue, ctx);
            }
            else
            {
                res = ctx->GetLibrary()->GetUndefined();
            }
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarScalarArgumentAction, EventKind::GetOwnPropertyInfoActionTag>(executeContext, evt, res);
        }